

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O3

size_t __thiscall
jsoncons::msgpack::
basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::get_size
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,uint8_t type,error_code *ec)

{
  ulong in_RAX;
  ssize_t sVar1;
  size_t sVar2;
  msgpack_errc __e;
  undefined7 in_register_00000031;
  uint8_t buf_2 [1];
  uint8_t buf [2];
  uint8_t buf_1 [4];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 0xc4:
  case 199:
  case 0xd9:
    sVar1 = stream_source<unsigned_char>::read
                      (&this->source_,(int)&uStack_18 + 1,(void *)0x1,0x7f414c);
    if (sVar1 == 1) {
      return uStack_18 >> 8 & 0xff;
    }
    goto LAB_001dd88d;
  case 0xc5:
  case 200:
  case 0xda:
  case 0xdc:
  case 0xde:
    sVar1 = stream_source<unsigned_char>::read
                      (&this->source_,(int)&uStack_18 + 2,(void *)0x2,0x7f414c);
    if (sVar1 == 2) {
      return (ulong)(ushort)(uStack_18._2_2_ << 8 | uStack_18._2_2_ >> 8);
    }
    goto LAB_001dd88d;
  case 0xc6:
  case 0xc9:
  case 0xdb:
  case 0xdd:
  case 0xdf:
    sVar1 = stream_source<unsigned_char>::read
                      (&this->source_,(int)&uStack_18 + 4,(void *)0x4,0x7f414c);
    if (sVar1 == 4) {
      return (ulong)(uStack_18._4_4_ >> 0x18 | (uStack_18._4_4_ & 0xff0000) >> 8 |
                     (uStack_18._4_4_ & 0xff00) << 8 | uStack_18._4_4_ << 0x18);
    }
LAB_001dd88d:
    __e = unexpected_eof;
LAB_001dd895:
    std::error_code::operator=(ec,__e);
    this->more_ = false;
    sVar2 = 0;
    break;
  default:
    if ((char)type < -0x70 || (type & 0xf0) == 0x90) {
      return (ulong)(type & 0xf);
    }
    __e = unknown_type;
    goto LAB_001dd895;
  case 0xd4:
    sVar2 = 1;
    break;
  case 0xd5:
    sVar2 = 2;
    break;
  case 0xd6:
    sVar2 = 4;
    break;
  case 0xd7:
    sVar2 = 8;
    break;
  case 0xd8:
    sVar2 = 0x10;
  }
  return sVar2;
}

Assistant:

std::size_t get_size(uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::msgpack::msgpack_type::str8_type: 
            case jsoncons::msgpack::msgpack_type::bin8_type: 
            case jsoncons::msgpack::msgpack_type::ext8_type: 
            {
                uint8_t buf[sizeof(int8_t)];
                if (source_.read(buf, sizeof(int8_t)) != sizeof(int8_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint8_t len = binary::big_to_native<uint8_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }

            case jsoncons::msgpack::msgpack_type::str16_type: 
            case jsoncons::msgpack::msgpack_type::bin16_type: 
            case jsoncons::msgpack::msgpack_type::ext16_type: 
            case jsoncons::msgpack::msgpack_type::array16_type: 
            case jsoncons::msgpack::msgpack_type::map16_type:
            {
                uint8_t buf[sizeof(int16_t)];
                if (source_.read(buf, sizeof(int16_t)) != sizeof(int16_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint16_t len = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }

            case jsoncons::msgpack::msgpack_type::str32_type: 
            case jsoncons::msgpack::msgpack_type::bin32_type: 
            case jsoncons::msgpack::msgpack_type::ext32_type: 
            case jsoncons::msgpack::msgpack_type::array32_type: 
            case jsoncons::msgpack::msgpack_type::map32_type : 
            {
                uint8_t buf[sizeof(int32_t)];
                if (source_.read(buf, sizeof(int32_t)) != sizeof(int32_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint32_t len = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }
            case jsoncons::msgpack::msgpack_type::fixext1_type: 
                return 1;
            case jsoncons::msgpack::msgpack_type::fixext2_type: 
                return 2;
            case jsoncons::msgpack::msgpack_type::fixext4_type: 
                return 4;
            case jsoncons::msgpack::msgpack_type::fixext8_type: 
                return 8;
            case jsoncons::msgpack::msgpack_type::fixext16_type: 
                return 16;
            default:
                if ((type > 0x8f && type <= 0x9f) // fixarray
                    || (type > 0x7f && type <= 0x8f) // fixmap
        )
                {
                    return type & 0x0f;
                }
                else
                {
                    ec = msgpack_errc::unknown_type;
                    more_ = false;
                    return 0;
                }
                break;
        }
    }